

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

man_page *
clipp::make_man_page
          (man_page *__return_storage_ptr__,group *cli,doc_string *progname,doc_formatting *fmt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  string local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  _Any_data local_630;
  code *local_620;
  string local_610;
  string local_5f0;
  param_filter local_5d0;
  documentation local_5a8;
  
  __return_storage_ptr__->sectionSpc_ = 1;
  (__return_storage_ptr__->sections_).
  super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->sections_).
  super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->sections_).
  super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->progName_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->progName_).field_2;
  (__return_storage_ptr__->progName_)._M_string_length = 0;
  (__return_storage_ptr__->progName_).field_2._M_local_buf[0] = '\0';
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"SYNOPSIS","");
  pcVar2 = (progname->_M_dataplus)._M_p;
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_670,pcVar2,pcVar2 + progname->_M_string_length);
  usage_lines::usage_lines((usage_lines *)&local_5a8,cli,&local_670,fmt);
  usage_lines::str_abi_cxx11_(&local_5f0,(usage_lines *)&local_5a8);
  std::vector<clipp::man_page::section,std::allocator<clipp::man_page::section>>::
  emplace_back<std::__cxx11::string,std::__cxx11::string>
            ((vector<clipp::man_page::section,std::allocator<clipp::man_page::section>> *)
             &__return_storage_ptr__->sections_,&local_650,&local_5f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8.usgFmt_.paramSep_._M_dataplus._M_p != &local_5a8.usgFmt_.paramSep_.field_2) {
    operator_delete(local_5a8.usgFmt_.paramSep_._M_dataplus._M_p,
                    local_5a8.usgFmt_.paramSep_.field_2._M_allocated_capacity + 1);
  }
  doc_formatting::~doc_formatting(&local_5a8.fmt_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"OPTIONS","");
  paVar1 = &local_5d0.prefix_.field_2;
  local_5d0.prefix_.field_2._M_allocated_capacity = 0;
  local_5d0.prefix_.field_2._8_8_ = 0;
  local_5d0.prefix_._M_string_length = 0;
  local_5d0.required_ = either;
  local_5d0.blocking_ = either;
  local_5d0.repeatable_ = either;
  local_5d0.hasDoc_ = yes;
  local_5d0._36_4_ = 0;
  local_5d0.prefix_._M_dataplus._M_p = (pointer)paVar1;
  std::function<bool(clipp::parameter_const&)>::function<clipp::param_filter,void>
            ((function<bool(clipp::parameter_const&)> *)local_630._M_pod_data,&local_5d0);
  documentation::documentation(&local_5a8,cli,fmt,(filter_function *)&local_630);
  documentation::str_abi_cxx11_(&local_610,&local_5a8);
  std::vector<clipp::man_page::section,std::allocator<clipp::man_page::section>>::
  emplace_back<std::__cxx11::string,std::__cxx11::string>
            ((vector<clipp::man_page::section,std::allocator<clipp::man_page::section>> *)
             &__return_storage_ptr__->sections_,&local_690,&local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  if (local_5a8.filter_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5a8.filter_.super__Function_base._M_manager)
              ((_Any_data *)&local_5a8.filter_,(_Any_data *)&local_5a8.filter_,__destroy_functor);
  }
  doc_formatting::~doc_formatting(&local_5a8.usgFmt_);
  doc_formatting::~doc_formatting(&local_5a8.fmt_);
  if (local_620 != (code *)0x0) {
    (*local_620)(&local_630,&local_630,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0.prefix_._M_dataplus._M_p != paVar1) {
    operator_delete(local_5d0.prefix_._M_dataplus._M_p,
                    local_5d0.prefix_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline man_page
make_man_page(const group& cli,
              doc_string progname = "",
              const doc_formatting& fmt = doc_formatting{})
{
    man_page man;
    man.append_section("SYNOPSIS", usage_lines(cli,progname,fmt).str());
    man.append_section("OPTIONS", documentation(cli,fmt).str());
    return man;
}